

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O1

spv_result_t __thiscall
spvtools::FriendlyNameMapper::ParseInstruction
          (FriendlyNameMapper *this,spv_parsed_instruction_t *inst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  uint id;
  uint32_t id_00;
  uint uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  ulong *puVar10;
  uint32_t in_EDX;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  char *pcVar11;
  size_type sVar12;
  ulong uVar13;
  ulong uVar14;
  spvtools *this_00;
  __string_type *__range3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  string *this_01;
  __node_base_ptr p_Var19;
  __node_base_ptr p_Var20;
  __string_type value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  this_01 = &local_248;
  id = inst->result_id;
  this_00 = (spvtools *)(ulong)id;
  uVar2 = inst->opcode;
  if (0x46 < uVar2) {
    if (uVar2 < 0x147) {
      if (uVar2 == 0x47) {
        puVar4 = inst->words;
        if (puVar4[2] != 0xb) {
          return SPV_SUCCESS;
        }
        if (3 < inst->num_words) {
          SaveBuiltInName(this,puVar4[1],puVar4[3]);
          return SPV_SUCCESS;
        }
        __assert_fail("inst.num_words > 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/name_mapper.cpp"
                      ,0xaf,
                      "spv_result_t spvtools::FriendlyNameMapper::ParseInstruction(const spv_parsed_instruction_t &)"
                     );
      }
      if (uVar2 != 0x142) goto switchD_001c1113_caseD_6;
      pcVar16 = "PipeStorage";
      pcVar11 = "";
      goto LAB_001c1ea7;
    }
    if (uVar2 == 0x147) {
      pcVar16 = "NamedBarrier";
      pcVar11 = "";
      goto LAB_001c1ea7;
    }
    if (uVar2 != 0x1141) goto switchD_001c1113_caseD_6;
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"_ptr_","");
    NameForEnumOperand_abi_cxx11_(&local_228,this,SPV_OPERAND_TYPE_STORAGE_CLASS,inst->words[2]);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_228._M_string_length + local_248._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar17 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_228._M_string_length + local_248._M_string_length)
      goto LAB_001c121b;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_228,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001c121b:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228._M_dataplus._M_p)
      ;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0].field_2._8_8_ = puVar7[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8[0]._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,id,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) goto LAB_001c194b;
    goto LAB_001c1958;
  }
  switch(uVar2) {
  case 5:
    id_00 = inst->words[1];
    spvDecodeLiteralStringOperand_abi_cxx11_(local_1a8,inst,1);
    SaveName(this,id_00,local_1a8);
    goto LAB_001c2435;
  default:
switchD_001c1113_caseD_6:
    if (this_00 == (spvtools *)0x0) {
      return SPV_SUCCESS;
    }
    uVar5 = (this->name_for_id_)._M_h._M_bucket_count;
    uVar13 = (ulong)this_00 % uVar5;
    p_Var19 = (this->name_for_id_)._M_h._M_buckets[uVar13];
    uVar14 = uVar13;
    p_Var20 = (__node_base_ptr)0x0;
    if ((p_Var19 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var19->_M_nxt, p_Var20 = p_Var19, id != *(uint *)&p_Var19->_M_nxt[1]._M_nxt)) {
      while (p_Var19 = p_Var6, p_Var6 = p_Var19->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        uVar14 = (ulong)*(uint *)&p_Var6[1]._M_nxt % uVar5;
        p_Var20 = (__node_base_ptr)0x0;
        if ((uVar14 != uVar13) || (p_Var20 = p_Var19, id == *(uint *)&p_Var6[1]._M_nxt))
        goto LAB_001c2404;
      }
      p_Var20 = (__node_base_ptr)0x0;
    }
LAB_001c2404:
    if ((p_Var20 != (__node_base_ptr)0x0) && (p_Var20->_M_nxt != (_Hash_node_base *)0x0)) {
      return SPV_SUCCESS;
    }
    to_string_abi_cxx11_(local_1a8,this_00,(uint32_t)uVar14);
    SaveName(this,id,local_1a8);
LAB_001c2435:
    local_208.field_2._M_allocated_capacity = local_1a8[0].field_2._M_allocated_capacity;
    _Var18._M_p = local_1a8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001c222e;
  case 0x13:
    pcVar16 = "void";
    pcVar11 = "";
    break;
  case 0x14:
    pcVar16 = "bool";
    pcVar11 = "";
    break;
  case 0x15:
    paVar1 = &local_1a8[0].field_2;
    local_1a8[0]._M_string_length = 0;
    local_1a8[0].field_2._M_allocated_capacity =
         local_1a8[0].field_2._M_allocated_capacity & 0xffffffffffffff00;
    paVar15 = &local_248.field_2;
    local_248._M_string_length = 0;
    local_248.field_2._M_allocated_capacity =
         local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar3 = inst->words[2];
    local_248._M_dataplus._M_p = (pointer)paVar15;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
    switch(uVar3 << 0x1d | uVar3 - 8 >> 3) {
    case 0:
      pcVar11 = "char";
      break;
    case 1:
      pcVar11 = "short";
      this_01 = &local_248;
      break;
    default:
      to_string_abi_cxx11_(&local_228,(spvtools *)(ulong)uVar3,in_EDX);
      std::__cxx11::string::operator=((string *)&local_248,(string *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      pcVar11 = "i";
      this_01 = local_1a8;
      break;
    case 3:
      pcVar11 = "int";
      this_01 = &local_248;
      break;
    case 7:
      pcVar11 = "long";
      this_01 = &local_248;
    }
    std::__cxx11::string::operator=((string *)this_01,pcVar11);
    if (inst->words[3] == 0) {
      std::__cxx11::string::operator=((string *)local_1a8,"u");
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_1a8[0]._M_dataplus._M_p,
               local_1a8[0]._M_dataplus._M_p + local_1a8[0]._M_string_length);
    std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248._M_dataplus._M_p);
    SaveName(this,id,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar15) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    local_208.field_2._M_allocated_capacity = local_1a8[0].field_2._M_allocated_capacity;
    _Var18._M_p = local_1a8[0]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == paVar1) {
      return SPV_SUCCESS;
    }
    goto LAB_001c222e;
  case 0x16:
    uVar3 = inst->words[2];
    if (uVar3 == 0x40) {
      pcVar16 = "double";
      pcVar11 = "";
    }
    else if (uVar3 == 0x20) {
      pcVar16 = "float";
      pcVar11 = "";
    }
    else {
      if (uVar3 != 0x10) {
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"fp","");
        to_string_abi_cxx11_(&local_228,(spvtools *)(ulong)uVar3,n_01);
        std::operator+(local_1a8,&local_248,&local_228);
        SaveName(this,id,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        local_208.field_2._M_allocated_capacity = local_248.field_2._M_allocated_capacity;
        _Var18._M_p = local_248._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p == &local_248.field_2) {
          return SPV_SUCCESS;
        }
        goto LAB_001c222e;
      }
      pcVar16 = "half";
      pcVar11 = "";
    }
    break;
  case 0x17:
    pcVar16 = "v";
    pcVar11 = "";
    goto LAB_001c164b;
  case 0x18:
    pcVar16 = "mat";
    pcVar11 = "";
LAB_001c164b:
    paVar15 = &local_228.field_2;
    local_228._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,pcVar16,pcVar11);
    to_string_abi_cxx11_(&local_208,(spvtools *)(ulong)inst->words[3],n);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar15) {
      uVar17 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_208._M_string_length + local_228._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        uVar17 = local_208.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_208._M_string_length + local_228._M_string_length)
      goto LAB_001c16ae;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_208,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
    }
    else {
LAB_001c16ae:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_208._M_dataplus._M_p)
      ;
    }
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248.field_2._8_8_ = puVar7[3];
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_248._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    NameForId_abi_cxx11_(&local_1e8,this,inst->words[2]);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1e8._M_string_length + local_248._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar17 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1e8._M_string_length + local_248._M_string_length)
      goto LAB_001c1a19;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001c1a19:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1e8._M_dataplus._M_p)
      ;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0].field_2._8_8_ = puVar7[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8[0]._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,id,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_208.field_2._M_allocated_capacity = local_228.field_2._M_allocated_capacity;
    _Var18._M_p = local_228._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == paVar15) {
      return SPV_SUCCESS;
    }
    goto LAB_001c222e;
  case 0x1c:
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"_arr_","");
    NameForId_abi_cxx11_(&local_1e8,this,inst->words[2]);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1e8._M_string_length + local_208._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar17 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1e8._M_string_length + local_208._M_string_length)
      goto LAB_001c1564;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
    }
    else {
LAB_001c1564:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p)
      ;
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228.field_2._8_8_ = puVar7[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_228._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248.field_2._8_8_ = puVar7[3];
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_248._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    NameForId_abi_cxx11_(&local_1c8,this,inst->words[3]);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1c8._M_string_length + local_248._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        uVar17 = local_1c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1c8._M_string_length + local_248._M_string_length)
      goto LAB_001c208f;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001c208f:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1c8._M_dataplus._M_p)
      ;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0].field_2._8_8_ = puVar7[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8[0]._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,id,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
LAB_001c1dfb:
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    goto LAB_001c1e0b;
  case 0x1d:
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"_runtimearr_","");
    NameForId_abi_cxx11_(&local_228,this,inst->words[2]);
    goto LAB_001c17a2;
  case 0x1e:
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"_struct_","");
    to_string_abi_cxx11_(&local_228,this_00,n_00);
    goto LAB_001c17a2;
  case 0x1f:
    paVar15 = &local_248.field_2;
    local_248._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Opaque_","");
    spvDecodeLiteralStringOperand_abi_cxx11_(&local_208,inst,1);
    Sanitize(&local_228,(FriendlyNameMapper *)inst,&local_208);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != paVar15) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_228._M_string_length + local_248._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar17 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_228._M_string_length + local_248._M_string_length)
      goto LAB_001c1622;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_228,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001c1622:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228._M_dataplus._M_p)
      ;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0].field_2._8_8_ = puVar7[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8[0]._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,id,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_208.field_2._M_allocated_capacity = local_248.field_2._M_allocated_capacity;
    _Var18._M_p = local_248._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == paVar15) {
      return SPV_SUCCESS;
    }
    goto LAB_001c222e;
  case 0x20:
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"_ptr_","");
    NameForEnumOperand_abi_cxx11_(&local_1e8,this,SPV_OPERAND_TYPE_STORAGE_CLASS,inst->words[2]);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      uVar17 = local_208.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1e8._M_string_length + local_208._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        uVar17 = local_1e8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1e8._M_string_length + local_208._M_string_length)
      goto LAB_001c13d6;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_208._M_dataplus._M_p);
    }
    else {
LAB_001c13d6:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_208,(ulong)local_1e8._M_dataplus._M_p)
      ;
    }
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228.field_2._8_8_ = puVar7[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = *puVar10;
      local_228._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_228._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_228);
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248.field_2._8_8_ = puVar7[3];
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    }
    else {
      local_248.field_2._M_allocated_capacity = *puVar10;
      local_248._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_248._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    NameForId_abi_cxx11_(&local_1c8,this,inst->words[3]);
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1c8._M_string_length + local_248._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        uVar17 = local_1c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_1c8._M_string_length + local_248._M_string_length)
      goto LAB_001c1d43;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1c8,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001c1d43:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1c8._M_dataplus._M_p)
      ;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0].field_2._8_8_ = puVar7[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8[0]._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,id,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_001c1dfb;
LAB_001c1e0b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    _Var18._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001c222e;
  case 0x22:
    pcVar16 = "Event";
    pcVar11 = "";
    break;
  case 0x23:
    pcVar16 = "DeviceEvent";
    pcVar11 = "";
    break;
  case 0x24:
    pcVar16 = "ReserveId";
    pcVar11 = "";
    break;
  case 0x25:
    pcVar16 = "Queue";
    pcVar11 = "";
    break;
  case 0x26:
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Pipe","");
    NameForEnumOperand_abi_cxx11_(&local_228,this,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,inst->words[2]);
LAB_001c17a2:
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      uVar17 = local_248.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_228._M_string_length + local_248._M_string_length) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar17 = local_228.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_228._M_string_length + local_248._M_string_length)
      goto LAB_001c17d8;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_228,0,(char *)0x0,(ulong)local_248._M_dataplus._M_p);
    }
    else {
LAB_001c17d8:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228._M_dataplus._M_p)
      ;
    }
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    puVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0].field_2._8_8_ = puVar7[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *puVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_1a8[0]._M_string_length = puVar7[1];
    *puVar7 = puVar10;
    puVar7[1] = 0;
    *(undefined1 *)puVar10 = 0;
    SaveName(this,id,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
LAB_001c194b:
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
LAB_001c1958:
    local_208.field_2._M_allocated_capacity = local_248.field_2._M_allocated_capacity;
    _Var18._M_p = local_248._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) {
      return SPV_SUCCESS;
    }
    goto LAB_001c222e;
  case 0x29:
    pcVar16 = "true";
    pcVar11 = "";
    break;
  case 0x2a:
    pcVar16 = "false";
    pcVar11 = "";
    break;
  case 0x2b:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    EmitNumericLiteral((ostream *)local_1a8,inst,inst->operands + 2);
    std::__cxx11::stringbuf::str();
    if (local_248._M_string_length != 0) {
      sVar12 = 0;
      do {
        if (local_248._M_dataplus._M_p[sVar12] == '-') {
          local_248._M_dataplus._M_p[sVar12] = 'n';
        }
        sVar12 = sVar12 + 1;
      } while (local_248._M_string_length != sVar12);
    }
    NameForId_abi_cxx11_(&local_1e8,this,inst->type_id);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_208.field_2._M_allocated_capacity = *psVar9;
      local_208.field_2._8_8_ = plVar8[3];
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar9;
      local_208._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_208._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_208,(ulong)local_248._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_228.field_2._M_allocated_capacity = *psVar9;
      local_228.field_2._8_8_ = plVar8[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar9;
      local_228._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_228._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    SaveName(this,id,&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return SPV_SUCCESS;
  }
LAB_001c1ea7:
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar16,pcVar11);
  SaveName(this,id,local_1a8);
  local_208.field_2._M_allocated_capacity = local_1a8[0].field_2._M_allocated_capacity;
  _Var18._M_p = local_1a8[0]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
LAB_001c222e:
    operator_delete(_Var18._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t FriendlyNameMapper::ParseInstruction(
    const spv_parsed_instruction_t& inst) {
  const auto result_id = inst.result_id;
  switch (spv::Op(inst.opcode)) {
    case spv::Op::OpName:
      SaveName(inst.words[1], spvDecodeLiteralStringOperand(inst, 1));
      break;
    case spv::Op::OpDecorate:
      // Decorations come after OpName.  So OpName will take precedence over
      // decorations.
      //
      // In theory, we should also handle OpGroupDecorate.  But that's unlikely
      // to occur.
      if (spv::Decoration(inst.words[2]) == spv::Decoration::BuiltIn) {
        assert(inst.num_words > 3);
        SaveBuiltInName(inst.words[1], inst.words[3]);
      }
      break;
    case spv::Op::OpTypeVoid:
      SaveName(result_id, "void");
      break;
    case spv::Op::OpTypeBool:
      SaveName(result_id, "bool");
      break;
    case spv::Op::OpTypeInt: {
      std::string signedness;
      std::string root;
      const auto bit_width = inst.words[2];
      switch (bit_width) {
        case 8:
          root = "char";
          break;
        case 16:
          root = "short";
          break;
        case 32:
          root = "int";
          break;
        case 64:
          root = "long";
          break;
        default:
          root = to_string(bit_width);
          signedness = "i";
          break;
      }
      if (0 == inst.words[3]) signedness = "u";
      SaveName(result_id, signedness + root);
    } break;
    case spv::Op::OpTypeFloat: {
      const auto bit_width = inst.words[2];
      // TODO: Handle optional fpencoding enum once actually used.
      switch (bit_width) {
        case 16:
          SaveName(result_id, "half");
          break;
        case 32:
          SaveName(result_id, "float");
          break;
        case 64:
          SaveName(result_id, "double");
          break;
        default:
          SaveName(result_id, std::string("fp") + to_string(bit_width));
          break;
      }
    } break;
    case spv::Op::OpTypeVector:
      SaveName(result_id, std::string("v") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeMatrix:
      SaveName(result_id, std::string("mat") + to_string(inst.words[3]) +
                              NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypeArray:
      SaveName(result_id, std::string("_arr_") + NameForId(inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeRuntimeArray:
      SaveName(result_id,
               std::string("_runtimearr_") + NameForId(inst.words[2]));
      break;
    case spv::Op::OpTypePointer:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]) +
                              "_" + NameForId(inst.words[3]));
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      SaveName(result_id, std::string("_ptr_") +
                              NameForEnumOperand(SPV_OPERAND_TYPE_STORAGE_CLASS,
                                                 inst.words[2]));
      break;
    case spv::Op::OpTypePipe:
      SaveName(result_id,
               std::string("Pipe") +
                   NameForEnumOperand(SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
                                      inst.words[2]));
      break;
    case spv::Op::OpTypeEvent:
      SaveName(result_id, "Event");
      break;
    case spv::Op::OpTypeDeviceEvent:
      SaveName(result_id, "DeviceEvent");
      break;
    case spv::Op::OpTypeReserveId:
      SaveName(result_id, "ReserveId");
      break;
    case spv::Op::OpTypeQueue:
      SaveName(result_id, "Queue");
      break;
    case spv::Op::OpTypeOpaque:
      SaveName(result_id, std::string("Opaque_") +
                              Sanitize(spvDecodeLiteralStringOperand(inst, 1)));
      break;
    case spv::Op::OpTypePipeStorage:
      SaveName(result_id, "PipeStorage");
      break;
    case spv::Op::OpTypeNamedBarrier:
      SaveName(result_id, "NamedBarrier");
      break;
    case spv::Op::OpTypeStruct:
      // Structs are mapped rather simplisitically. Just indicate that they
      // are a struct and then give the raw Id number.
      SaveName(result_id, std::string("_struct_") + to_string(result_id));
      break;
    case spv::Op::OpConstantTrue:
      SaveName(result_id, "true");
      break;
    case spv::Op::OpConstantFalse:
      SaveName(result_id, "false");
      break;
    case spv::Op::OpConstant: {
      std::ostringstream value;
      EmitNumericLiteral(&value, inst, inst.operands[2]);
      auto value_str = value.str();
      // Use 'n' to signify negative. Other invalid characters will be mapped
      // to underscore.
      for (auto& c : value_str)
        if (c == '-') c = 'n';
      SaveName(result_id, NameForId(inst.type_id) + "_" + value_str);
    } break;
    default:
      // If this instruction otherwise defines an Id, then save a mapping for
      // it.  This is needed to ensure uniqueness in there is an OpName with
      // string something like "1" that might collide with this result_id.
      // We should only do this if a name hasn't already been registered by some
      // previous forward reference.
      if (result_id && name_for_id_.find(result_id) == name_for_id_.end())
        SaveName(result_id, to_string(result_id));
      break;
  }
  return SPV_SUCCESS;
}